

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawLineBezier(Vector2 startPos,Vector2 endPos,float thick,Color color)

{
  long lVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_1c8;
  float fStack_1c4;
  float local_1a8;
  Vector2 local_198;
  float afStack_190 [98];
  
  fVar4 = startPos.y;
  memset(afStack_190 + 2,0,0x180);
  local_1a8 = startPos.x;
  local_1c8 = endPos.x;
  fStack_1c4 = endPos.y;
  fVar3 = (fStack_1c4 - fVar4) * 0.5;
  local_198.x = 0.0;
  local_198.y = 0.0;
  afStack_190[0] = 0.0;
  afStack_190[1] = 0.0;
  iVar2 = 1;
  fVar10 = local_1a8;
  fVar11 = fVar4;
  for (lVar1 = 0x10; lVar1 != 400; lVar1 = lVar1 + 0x10) {
    fVar5 = (float)iVar2 / 12.0;
    if (1.0 <= fVar5) {
      fVar5 = fVar5 + -2.0;
      fVar5 = (fVar5 * fVar5 * fVar5 + 2.0) * fVar3;
    }
    else {
      fVar5 = fVar3 * fVar5 * fVar5 * fVar5;
    }
    fVar5 = fVar5 + fVar4;
    fVar6 = (local_1c8 - local_1a8) / 24.0 + fVar10;
    fVar7 = fVar5 - fVar11;
    fVar9 = fVar6 - fVar10;
    fVar8 = (thick * 0.5) / SQRT(fVar9 * fVar9 + fVar7 * fVar7);
    if (lVar1 == 0x10) {
      local_198.x = fVar7 * fVar8 + fVar10;
      local_198.y = -fVar9 * fVar8 + fVar11;
      afStack_190[0] = -fVar7 * fVar8 + fVar10;
      afStack_190[1] = fVar8 * fVar9 + fVar11;
    }
    *(float *)((long)&local_198.x + lVar1) = fVar6 + fVar8 * fVar7;
    *(float *)((long)afStack_190 + lVar1 + -4) = fVar5 + fVar8 * -fVar9;
    *(float *)((long)afStack_190 + lVar1) = fVar6 + fVar8 * -fVar7;
    *(float *)((long)afStack_190 + lVar1 + 4) = fVar5 + fVar8 * fVar9;
    iVar2 = iVar2 + 1;
    fVar10 = fVar6;
    fVar11 = fVar5;
  }
  DrawTriangleStrip(&local_198,0x32,color);
  return;
}

Assistant:

void DrawLineBezier(Vector2 startPos, Vector2 endPos, float thick, Color color)
{
    Vector2 previous = startPos;
    Vector2 current = { 0 };

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        // Cubic easing in-out
        // NOTE: Easing is calculated only for y position value
        current.y = EaseCubicInOut((float)i, startPos.y, endPos.y - startPos.y, (float)SPLINE_SEGMENT_DIVISIONS);
        current.x = previous.x + (endPos.x - startPos.x)/(float)SPLINE_SEGMENT_DIVISIONS;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}